

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O0

exr_result_t unpack_sample_table(exr_const_context_t ctxt,exr_decode_pipeline_t *decode)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint32_t uVar4;
  long in_RSI;
  long in_RDI;
  int32_t nsamps_1;
  int32_t x_1;
  int32_t prevsamp_1;
  int32_t *cursampline_1;
  int32_t y_1;
  int32_t nsamps;
  int32_t x;
  int32_t prevsamp;
  int32_t *cursampline;
  int32_t y;
  int c;
  size_t combSampSize;
  int32_t *samptable;
  uint64_t totsamp;
  int32_t h;
  int32_t w;
  exr_result_t rv;
  int local_70;
  uint32_t local_6c;
  int local_60;
  int local_58;
  uint32_t local_54;
  int local_48;
  int local_44;
  long local_40;
  ulong local_30;
  exr_result_t local_1c;
  
  local_1c = 0;
  iVar1 = *(int *)(in_RSI + 0x30);
  iVar2 = *(int *)(in_RSI + 0x2c);
  local_30 = 0;
  lVar3 = *(long *)(in_RSI + 0xa8);
  local_40 = 0;
  for (local_44 = 0; local_44 < *(short *)(in_RSI + 0x10); local_44 = local_44 + 1) {
    local_40 = *(char *)(*(long *)(in_RSI + 8) + (long)local_44 * 0x30 + 0x19) + local_40;
  }
  if ((*(ushort *)(in_RSI + 0x12) & 1) == 0) {
    for (local_60 = 0; local_60 < iVar2; local_60 = local_60 + 1) {
      local_6c = 0;
      for (local_70 = 0; local_70 < iVar1; local_70 = local_70 + 1) {
        uVar4 = one_to_native32(0);
        if ((int)uVar4 < (int)local_6c) {
          return 0x1f;
        }
        *(uint32_t *)(lVar3 + (long)(local_60 * iVar1) * 4 + (long)local_70 * 4) = uVar4;
        local_6c = uVar4;
      }
      local_30 = (long)(int)local_6c + local_30;
    }
    if (0x7ffffffe < local_30) {
      return 0x1f;
    }
  }
  else {
    for (local_48 = 0; local_48 < iVar2; local_48 = local_48 + 1) {
      local_54 = 0;
      for (local_58 = 0; local_58 < iVar1; local_58 = local_58 + 1) {
        uVar4 = one_to_native32(0);
        if ((int)uVar4 < (int)local_54) {
          return 0x1f;
        }
        *(uint32_t *)(lVar3 + (long)(local_48 * iVar1) * 4 + (long)local_58 * 4) = uVar4 - local_54;
        local_54 = uVar4;
      }
      local_30 = (long)(int)local_54 + local_30;
    }
    if (0x7ffffffe < local_30) {
      return 0x1f;
    }
    *(int *)(lVar3 + (long)(iVar1 * iVar2) * 4) = (int)local_30;
  }
  if (*(ulong *)(in_RSI + 0x48) <= local_30 * local_40 &&
      local_30 * local_40 - *(ulong *)(in_RSI + 0x48) != 0) {
    local_1c = (**(code **)(in_RDI + 0x40))(in_RDI,0x1f,"Corrupt sample count table");
  }
  return local_1c;
}

Assistant:

static exr_result_t
unpack_sample_table (exr_const_context_t ctxt, exr_decode_pipeline_t* decode)
{
    exr_result_t rv           = EXR_ERR_SUCCESS;
    int32_t      w            = decode->chunk.width;
    int32_t      h            = decode->chunk.height;
    uint64_t     totsamp      = 0;
    int32_t*     samptable    = decode->sample_count_table;
    size_t       combSampSize = 0;

    for (int c = 0; c < decode->channel_count; ++c)
        combSampSize += ((size_t) decode->channels[c].bytes_per_element);

    if ((decode->decode_flags & EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
    {
        for (int32_t y = 0; y < h; ++y)
        {
            int32_t* cursampline = samptable + y * w;
            int32_t  prevsamp    = 0;
            for (int32_t x = 0; x < w; ++x)
            {
                int32_t nsamps =
                    (int32_t) one_to_native32 ((uint32_t) cursampline[x]);
                // not monotonic, violation
                if (nsamps < prevsamp) return EXR_ERR_INVALID_SAMPLE_DATA;
                cursampline[x] = nsamps - prevsamp;
                prevsamp       = nsamps;
            }
            totsamp += (uint64_t) prevsamp;
        }
        if (totsamp >= (uint64_t) INT32_MAX) return EXR_ERR_INVALID_SAMPLE_DATA;
        samptable[w * h] = (int32_t) totsamp;
    }
    else
    {
        for (int32_t y = 0; y < h; ++y)
        {
            int32_t* cursampline = samptable + y * w;
            int32_t  prevsamp    = 0;
            for (int32_t x = 0; x < w; ++x)
            {
                int32_t nsamps =
                    (int32_t) one_to_native32 ((uint32_t) cursampline[x]);
                // not monotonic, violation
                if (nsamps < prevsamp) return EXR_ERR_INVALID_SAMPLE_DATA;

                cursampline[x] = nsamps;
                prevsamp       = nsamps;
            }

            totsamp += (uint64_t) prevsamp;
        }
        if (totsamp >= (uint64_t) INT32_MAX) return EXR_ERR_INVALID_SAMPLE_DATA;
    }

    if ((totsamp * combSampSize) > decode->chunk.unpacked_size)
    {
        rv = ctxt->report_error (
            ctxt, EXR_ERR_INVALID_SAMPLE_DATA, "Corrupt sample count table");
    }

    return rv;
}